

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<btVector3>::resize
          (btAlignedObjectArray<btVector3> *this,int newsize,btVector3 *fillData)

{
  undefined8 *puVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  
  iVar2 = this->m_size;
  lVar5 = (long)iVar2;
  if (iVar2 <= newsize) {
    if (iVar2 < newsize) {
      reserve(this,newsize);
    }
    lVar4 = lVar5 << 4;
    for (; lVar5 < newsize; lVar5 = lVar5 + 1) {
      uVar3 = *(undefined8 *)(fillData->m_floats + 2);
      puVar1 = (undefined8 *)((long)this->m_data->m_floats + lVar4);
      *puVar1 = *(undefined8 *)fillData->m_floats;
      puVar1[1] = uVar3;
      lVar4 = lVar4 + 0x10;
    }
  }
  this->m_size = newsize;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void	resize(int newsize, const T& fillData=T())
		{
			const BT_REGISTER int curSize = size();

			if (newsize < curSize)
			{
				for(int i = newsize; i < curSize; i++)
				{
					m_data[i].~T();
				}
			} else
			{
				if (newsize > curSize)
				{
					reserve(newsize);
				}
#ifdef BT_USE_PLACEMENT_NEW
				for (int i=curSize;i<newsize;i++)
				{
					new ( &m_data[i]) T(fillData);
				}
#endif //BT_USE_PLACEMENT_NEW

			}

			m_size = newsize;
		}